

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O1

EncounteredQmlMacro __thiscall Moc::parseClassInfo(Moc *this,BaseDef *def)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Symbol *pSVar4;
  QArrayData *pQVar5;
  qsizetype qVar6;
  Data *pDVar7;
  char *pcVar8;
  byte bVar9;
  QTypeRevision QVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QArrayData *local_78;
  storage_type *psStack_70;
  qsizetype local_68;
  ClassInfoDef local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (this->super_Parser).symbols.d.size;
  lVar3 = (this->super_Parser).index;
  if ((lVar2 <= lVar3) ||
     (pSVar4 = (this->super_Parser).symbols.d.ptr, pSVar4[lVar3].token != LPAREN))
  goto LAB_0011b94a;
  lVar1 = lVar3 + 1;
  (this->super_Parser).index = lVar1;
  local_58.value.d.ptr = (storage_type *)0x0;
  local_58.value.d.size = 0;
  local_58.name.d.size = 0;
  local_58.value.d.d = (Data *)0x0;
  local_58.name.d.d = (Data *)0x0;
  local_58.name.d.ptr = (storage_type *)0x0;
  if ((lVar2 <= lVar1) || (pSVar4[lVar1].token != PP_STRING_LITERAL)) goto LAB_0011b94a;
  (this->super_Parser).index = lVar3 + 2;
  QByteArray::mid((longlong)&local_78,(longlong)&pSVar4[lVar3 + 1].lex);
  pcVar8 = local_58.name.d.ptr;
  pDVar7 = local_58.name.d.d;
  qVar6 = local_68;
  pQVar5 = local_78;
  local_78 = &(local_58.name.d.d)->super_QArrayData;
  local_58.name.d.d = (Data *)pQVar5;
  local_58.name.d.ptr = psStack_70;
  psStack_70 = pcVar8;
  local_68 = local_58.name.d.size;
  local_58.name.d.size = qVar6;
  if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar7->super_QArrayData,1,0x10);
    }
  }
  QVar11.m_data = local_58.name.d.ptr;
  QVar11.m_size = local_58.name.d.size;
  QVar12.m_data = "QML.";
  QVar12.m_size = 4;
  bVar9 = QtPrivate::startsWith(QVar11,QVar12);
  lVar2 = (this->super_Parser).symbols.d.size;
  lVar3 = (this->super_Parser).index;
  if ((lVar2 <= lVar3) ||
     (pSVar4 = (this->super_Parser).symbols.d.ptr, pSVar4[lVar3].token != COMMA)) goto LAB_0011b94a;
  lVar1 = lVar3 + 1;
  (this->super_Parser).index = lVar1;
  if ((lVar1 < lVar2) && (pSVar4[lVar1].token == PP_STRING_LITERAL)) {
    (this->super_Parser).index = lVar3 + 2;
    QByteArray::mid((longlong)&local_78,(longlong)&pSVar4[lVar3 + 1].lex);
LAB_0011b741:
    pcVar8 = local_58.value.d.ptr;
    pDVar7 = local_58.value.d.d;
    qVar6 = local_68;
    pQVar5 = local_78;
    local_78 = &(local_58.value.d.d)->super_QArrayData;
    local_58.value.d.d = (Data *)pQVar5;
    local_58.value.d.ptr = psStack_70;
    psStack_70 = pcVar8;
    local_68 = local_58.value.d.size;
    local_58.value.d.size = qVar6;
    if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar7->super_QArrayData,1,0x10);
      }
    }
  }
  else {
    lVar3 = (this->super_Parser).index;
    if ((lVar3 < lVar2) && (pSVar4[lVar3].token == Q_REVISION_TOKEN)) {
      (this->super_Parser).index = lVar3 + 1;
      QVar10 = parseRevision(this);
      QByteArray::number((int)&local_78,(uint)(ushort)QVar10);
      goto LAB_0011b741;
    }
    lVar3 = (this->super_Parser).index;
    if ((lVar2 <= lVar3) || (pSVar4[lVar3].token != IDENTIFIER)) goto LAB_0011b94a;
    lVar1 = lVar3 + 1;
    (this->super_Parser).index = lVar1;
    if ((lVar2 <= lVar1) || (pSVar4[lVar1].token != LPAREN)) goto LAB_0011b94a;
    lVar1 = lVar3 + 2;
    (this->super_Parser).index = lVar1;
    if ((lVar2 <= lVar1) || (pSVar4[lVar1].token != PP_STRING_LITERAL)) goto LAB_0011b94a;
    (this->super_Parser).index = lVar3 + 3;
    QByteArray::mid((longlong)&local_78,(longlong)&pSVar4[lVar3 + 2].lex);
    pcVar8 = local_58.value.d.ptr;
    pDVar7 = local_58.value.d.d;
    qVar6 = local_68;
    pQVar5 = local_78;
    local_78 = &(local_58.value.d.d)->super_QArrayData;
    local_58.value.d.d = (Data *)pQVar5;
    local_58.value.d.ptr = psStack_70;
    psStack_70 = pcVar8;
    local_68 = local_58.value.d.size;
    local_58.value.d.size = qVar6;
    if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar7->super_QArrayData,1,0x10);
      }
    }
    lVar2 = (this->super_Parser).index;
    if (((this->super_Parser).symbols.d.size <= lVar2) ||
       ((this->super_Parser).symbols.d.ptr[lVar2].token != PP_RPAREN)) goto LAB_0011b94a;
    (this->super_Parser).index = lVar2 + 1;
  }
  lVar2 = (this->super_Parser).index;
  if ((lVar2 < (this->super_Parser).symbols.d.size) &&
     ((this->super_Parser).symbols.d.ptr[lVar2].token == PP_RPAREN)) {
    (this->super_Parser).index = lVar2 + 1;
    QtPrivate::QMovableArrayOps<ClassInfoDef>::emplace<ClassInfoDef_const&>
              ((QMovableArrayOps<ClassInfoDef> *)&def->classInfoList,(def->classInfoList).d.size,
               &local_58);
    QList<ClassInfoDef>::end(&def->classInfoList);
    if (&(local_58.value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_58.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_58.value.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_58.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_58.name.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return (EncounteredQmlMacro)(bVar9 ^ 1);
    }
    __stack_chk_fail();
  }
LAB_0011b94a:
  Parser::error(&this->super_Parser,(char *)0x0);
}

Assistant:

Moc::EncounteredQmlMacro Moc::parseClassInfo(BaseDef *def)
{
    bool encounteredQmlMacro = false;
    next(LPAREN);
    ClassInfoDef infoDef;
    next(STRING_LITERAL);
    infoDef.name = symbol().unquotedLexem();
    if (infoDef.name.startsWith("QML."))
        encounteredQmlMacro = true;
    next(COMMA);
    if (test(STRING_LITERAL)) {
        infoDef.value = symbol().unquotedLexem();
    } else if (test(Q_REVISION_TOKEN)) {
        infoDef.value = QByteArray::number(parseRevision().toEncodedVersion<quint16>());
    } else {
        // support Q_CLASSINFO("help", QT_TR_NOOP("blah"))
        next(IDENTIFIER);
        next(LPAREN);
        next(STRING_LITERAL);
        infoDef.value = symbol().unquotedLexem();
        next(RPAREN);
    }
    next(RPAREN);
    def->classInfoList += infoDef;
    return encounteredQmlMacro ? EncounteredQmlMacro::Yes : EncounteredQmlMacro::No;
}